

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

int Edg_ManEvalEdgeDelay(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  size_t __size;
  int iVar12;
  
  if ((p->vEdge1 == (Vec_Int_t *)0x0) || (p->vEdge2 == (Vec_Int_t *)0x0)) {
    __assert_fail("p->vEdge1 && p->vEdge2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x2c0,"int Edg_ManEvalEdgeDelay(Gia_Man_t *)");
  }
  pVVar6 = p->vEdgeDelay;
  uVar1 = p->nObjs;
  if (pVVar6 == (Vec_Int_t *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    uVar7 = 0x10;
    if (0xe < uVar1 - 1) {
      uVar7 = uVar1;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = uVar7;
    if (uVar7 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)(int)uVar7 << 2);
    }
    pVVar6->pArray = piVar5;
    pVVar6->nSize = uVar1;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,(long)(int)uVar1 << 2);
    }
    p->vEdgeDelay = pVVar6;
  }
  else {
    if (pVVar6->nCap < (int)uVar1) {
      __size = (long)(int)uVar1 << 2;
      if (pVVar6->pArray == (int *)0x0) {
        piVar5 = (int *)malloc(__size);
      }
      else {
        piVar5 = (int *)realloc(pVVar6->pArray,__size);
      }
      pVVar6->pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar6->nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset(pVVar6->pArray,0,(ulong)uVar1 * 4);
    }
    pVVar6->nSize = uVar1;
  }
  iVar4 = 0;
  if (1 < p->nObjs) {
    pVVar2 = p->vMapping2;
    iVar4 = 0;
    lVar8 = 1;
    do {
      if (pVVar2->nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar6 = pVVar2->pArray;
      uVar1 = pVVar6[lVar8].nSize;
      if ((ulong)uVar1 != 0) {
        pVVar3 = p->vEdgeDelay;
        if ((int)uVar1 < 1) {
          iVar9 = 0;
        }
        else {
          uVar11 = 0;
          uVar10 = (ulong)(uint)pVVar6[lVar8].nSize;
          if (pVVar6[lVar8].nSize < 1) {
            uVar10 = uVar11;
          }
          iVar9 = 0;
          do {
            if (uVar10 == uVar11) {
LAB_001f9d25:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar12 = pVVar6[lVar8].pArray[uVar11];
            if ((((long)iVar12 < 0) || (pVVar3->nSize <= iVar12)) || (p->vEdge1->nSize <= lVar8))
            goto LAB_001f9d25;
            uVar7 = 0;
            if (p->vEdge1->pArray[lVar8] != iVar12) {
              if (p->vEdge2->nSize <= lVar8) goto LAB_001f9d25;
              uVar7 = (uint)(p->vEdge2->pArray[lVar8] != iVar12);
            }
            iVar12 = uVar7 + pVVar3->pArray[iVar12];
            if (iVar9 <= iVar12) {
              iVar9 = iVar12;
            }
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        if (pVVar3->nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar3->pArray[lVar8] = iVar9;
        if (iVar4 <= iVar9) {
          iVar4 = iVar9;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nObjs);
  }
  return iVar4;
}

Assistant:

int Edg_ManEvalEdgeDelay( Gia_Man_t * p )
{
    int iLut, Delay, DelayMax = 0;
    assert( p->vEdge1 && p->vEdge2 );
    if ( p->vEdgeDelay == NULL )
        p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    else
        Vec_IntFill( p->vEdgeDelay, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut2( p, iLut )
    {
        Delay = Edg_ObjEvalEdgeDelay(p, iLut, p->vEdgeDelay);
        Vec_IntWriteEntry( p->vEdgeDelay, iLut, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    return DelayMax;
}